

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_offset_datetime<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  value_type vVar2;
  uint uVar3;
  local_date lVar4;
  size_t sVar5;
  offset_datetime_type x;
  char_type_conflict cVar6;
  error_type *this;
  value_type *pvVar7;
  const_reference pvVar8;
  value_type *pvVar9;
  uint *puVar10;
  error_type *this_00;
  value_type *pvVar11;
  error_info *v;
  error_info *v_00;
  basic_value<toml::type_config> *v_01;
  uint uVar12;
  error_info *ctx_00;
  string *psVar13;
  ushort uVar14;
  offset_datetime_format_info fmt;
  ulong uStackY_aa0;
  allocator<char> local_a82;
  allocator<char> local_a81;
  result<int,_toml::detail::none_t> hour_r;
  result<int,_toml::detail::none_t> minute_r;
  string ofs_str;
  region reg;
  source_location src;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  time_fmt_reg;
  location first;
  region ofs_reg;
  location local_668;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  date_fmt_reg;
  source_location local_5a8;
  source_location local_530;
  source_location local_4b8;
  source_location local_440;
  region local_3c8;
  error_info local_360;
  error_info local_308;
  undefined1 local_2b0 [200];
  error_info local_1e8;
  undefined1 local_190 [88];
  error_info local_138;
  undefined1 local_e0 [88];
  undefined1 local_88 [88];
  
  location::location(&first,loc);
  parse_local_date_only<toml::type_config>(&date_fmt_reg,loc,ctx);
  if (date_fmt_reg.is_ok_ == false) {
    this = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err(&date_fmt_reg,(source_location)0x45c1c0);
    err<toml::error_info&>((failure<toml::error_info> *)&local_308,(toml *)this,v);
    ctx_00 = &local_308;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_308);
    error_info::~error_info(&local_308);
    goto LAB_002eecf7;
  }
  cVar6 = location::current(loc);
  if (cVar6 == 'T') {
    uStackY_aa0 = 0;
  }
  else {
    cVar6 = location::current(loc);
    if (cVar6 == 't') {
      uStackY_aa0 = 1;
    }
    else {
      cVar6 = location::current(loc);
      if (cVar6 != ' ') {
        region::region((region *)&time_fmt_reg,loc);
        source_location::source_location(&src,(region *)&time_fmt_reg);
        region::~region((region *)&time_fmt_reg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7c8,
                   "toml::parse_offset_datetime: expect date-time delimiter `T` or ` `(space).",
                   (allocator<char> *)&ofs_reg);
        source_location::source_location(&local_440,&src);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"here",(allocator<char> *)&reg);
        make_error_info<>((error_info *)&time_fmt_reg,&local_7c8,&local_440,&local_7e8);
        err<toml::error_info>((failure<toml::error_info> *)local_88,(error_info *)&time_fmt_reg);
        ctx_00 = (error_info *)local_88;
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)local_88);
        error_info::~error_info((error_info *)local_88);
        error_info::~error_info((error_info *)&time_fmt_reg);
        std::__cxx11::string::~string((string *)&local_7e8);
        source_location::~source_location(&local_440);
        std::__cxx11::string::~string((string *)&local_7c8);
        source_location::~source_location(&src);
        goto LAB_002eecf7;
      }
      uStackY_aa0 = 2;
    }
  }
  location::advance(loc,1);
  parse_local_time_only<toml::type_config>(&time_fmt_reg,loc,ctx);
  if (time_fmt_reg.is_ok_ == false) {
    this_00 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
              ::unwrap_err(&time_fmt_reg,(source_location)0x45c1d8);
    err<toml::error_info&>((failure<toml::error_info> *)&local_360,(toml *)this_00,v_00);
    ctx_00 = &local_360;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_360);
    error_info::~error_info(&local_360);
  }
  else {
    pvVar7 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(&time_fmt_reg,(source_location)0x45c1f0);
    bVar1 = (pvVar7->
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.has_seconds;
    pvVar7 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(&time_fmt_reg,(source_location)0x45c208);
    sVar5 = (pvVar7->
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
            subsecond_precision;
    syntax::time_offset((either *)&src,&ctx->toml_spec_);
    either::scan(&ofs_reg,(either *)&src,loc);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&src.first_line_);
    if (ofs_reg.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,
                 "toml::parse_offset_datetime: invalid offset: offset must be like: Z, +01:00, or -10:00."
                 ,(allocator<char> *)&ofs_str);
      syntax::time_offset((either *)&reg,&ctx->toml_spec_);
      location::location(&local_668,loc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_828,"",(allocator<char> *)&hour_r);
      make_syntax_error<toml::detail::either>
                ((error_info *)&src,&local_808,(either *)&reg,&local_668,&local_828);
      err<toml::error_info>((failure<toml::error_info> *)local_e0,(error_info *)&src);
      ctx_00 = (error_info *)local_e0;
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)local_e0);
      error_info::~error_info((error_info *)local_e0);
      error_info::~error_info((error_info *)&src);
      std::__cxx11::string::~string((string *)&local_828);
      location::~location(&local_668);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)&reg.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      psVar13 = &local_808;
    }
    else {
      region::as_string_abi_cxx11_(&ofs_str,&ofs_reg);
      pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (&ofs_str,0);
      if ((*pvVar8 == '+') ||
         (pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   at(&ofs_str,0), *pvVar8 == '-')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs_str,1,2
                  );
        from_string<int>((detail *)&hour_r,(string *)&src);
        std::__cxx11::string::~string((string *)&src);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&src,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs_str,4,2
                  );
        from_string<int>((detail *)&minute_r,(string *)&src);
        std::__cxx11::string::~string((string *)&src);
        if (hour_r.is_ok_ == false) {
          region::region(&reg,loc);
          source_location::source_location(&src,&reg);
          region::~region(&reg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_848,
                     "toml::parse_offset_datetime: Failed to read offset hour part",&local_a81);
          source_location::source_location(&local_4b8,&src);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"here",&local_a82)
          ;
          make_error_info<>((error_info *)&reg,&local_848,&local_4b8,&local_868);
          err<toml::error_info>((failure<toml::error_info> *)&local_138,(error_info *)&reg);
          ctx_00 = &local_138;
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)&local_138);
          error_info::~error_info(&local_138);
          error_info::~error_info((error_info *)&reg);
          std::__cxx11::string::~string((string *)&local_868);
          source_location::~source_location(&local_4b8);
          psVar13 = &local_848;
        }
        else {
          if (minute_r.is_ok_ != false) {
            pvVar9 = result<int,_toml::detail::none_t>::unwrap(&hour_r,(source_location)0x45c220);
            vVar2 = *pvVar9;
            puVar10 = (uint *)result<int,_toml::detail::none_t>::unwrap
                                        (&minute_r,(source_location)0x45c238);
            uVar3 = *puVar10;
            pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::at(&ofs_str,0);
            uVar14 = (ushort)(byte)-(char)vVar2;
            if (*pvVar8 == '+') {
              uVar14 = (ushort)vVar2;
            }
            uVar12 = (uint)(byte)-(char)uVar3;
            if (*pvVar8 == '+') {
              uVar12 = uVar3;
            }
            goto LAB_002ee9a5;
          }
          region::region(&reg,loc);
          source_location::source_location(&src,&reg);
          region::~region(&reg);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_888,
                     "toml::parse_offset_datetime: Failed to read offset minute part",&local_a81);
          source_location::source_location(&local_530,&src);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,"here",&local_a82)
          ;
          make_error_info<>((error_info *)&reg,&local_888,&local_530,&local_8a8);
          err<toml::error_info>((failure<toml::error_info> *)local_190,(error_info *)&reg);
          ctx_00 = (error_info *)local_190;
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)local_190);
          error_info::~error_info((error_info *)local_190);
          error_info::~error_info((error_info *)&reg);
          std::__cxx11::string::~string((string *)&local_8a8);
          source_location::~source_location(&local_530);
          psVar13 = &local_888;
        }
        std::__cxx11::string::~string((string *)psVar13);
        source_location::~source_location(&src);
      }
      else {
        uVar14 = 0;
        uVar12 = 0;
LAB_002ee9a5:
        if (((byte)((char)uVar14 - 0x19U) < 0xcf) || ((byte)((char)uVar12 - 0x3dU) < 0x87)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8c8,
                     "toml::parse_offset_datetime: too large offset: |hour| <= 24, |minute| <= 60",
                     (allocator<char> *)&hour_r);
          region::region((region *)&src,&first,loc);
          source_location::source_location(&local_5a8,(region *)&src);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8e8,"here",(allocator<char> *)&minute_r);
          make_error_info<>((error_info *)&reg,&local_8c8,&local_5a8,&local_8e8);
          err<toml::error_info>((failure<toml::error_info> *)&local_1e8,(error_info *)&reg);
          ctx_00 = &local_1e8;
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)&local_1e8);
          error_info::~error_info(&local_1e8);
          error_info::~error_info((error_info *)&reg);
          std::__cxx11::string::~string((string *)&local_8e8);
          source_location::~source_location(&local_5a8);
          region::~region((region *)&src);
          std::__cxx11::string::~string((string *)&local_8c8);
        }
        else {
          region::region(&reg,&first,loc);
          pvVar11 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                    ::unwrap(&date_fmt_reg,(source_location)0x45c250);
          lVar4 = (pvVar11->
                  super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                  ).super__Head_base<0UL,_toml::local_date,_false>._M_head_impl;
          pvVar7 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                   ::unwrap(&time_fmt_reg,(source_location)0x45c268);
          uStackY_aa0 = (ulong)bVar1 << 8 | uStackY_aa0;
          hour_r.field_1._0_1_ =
               (pvVar7->
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour;
          hour_r.field_1._1_1_ =
               (pvVar7->
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute;
          hour_r.field_1._2_1_ =
               (pvVar7->
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second;
          hour_r.field_1._3_1_ =
               (pvVar7->
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.field_0x3;
          unique0x00012004 =
               (pvVar7->
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond;
          unique0x00012006 =
               (pvVar7->
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond;
          x.time.hour = hour_r.field_1._0_1_;
          x.time.minute = hour_r.field_1._1_1_;
          x.time.second = hour_r.field_1._2_1_;
          x.time._3_1_ = hour_r.field_1._3_1_;
          x.time.millisecond = unique0x00012004;
          x.time.microsecond = unique0x00012006;
          x.date = lVar4;
          x.time.nanosecond =
               (pvVar7->
               super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.nanosecond;
          x.offset = (time_offset)(uVar14 & 0xff | (ushort)((uVar12 & 0xff) << 8));
          local_908.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_908.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_908.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          hour_r._0_4_ = lVar4;
          region::region(&local_3c8,&reg);
          fmt.subsecond_precision = sVar5;
          fmt.delimiter = (char)uStackY_aa0;
          fmt.has_seconds = (bool)(char)(uStackY_aa0 >> 8);
          fmt._2_6_ = (int6)(uStackY_aa0 >> 0x10);
          basic_value<toml::type_config>::basic_value
                    ((basic_value<toml::type_config> *)&src,x,fmt,&local_908,&local_3c8);
          ok<toml::basic_value<toml::type_config>>
                    ((success<toml::basic_value<toml::type_config>_> *)local_2b0,(toml *)&src,v_01);
          ctx_00 = (error_info *)local_2b0;
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (__return_storage_ptr__,(success_type *)ctx_00);
          basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_2b0);
          basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&src);
          region::~region(&local_3c8);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_908);
          region::~region(&reg);
        }
      }
      psVar13 = &ofs_str;
    }
    std::__cxx11::string::~string((string *)psVar13);
    region::~region(&ofs_reg);
  }
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  ::cleanup(&time_fmt_reg,(EVP_PKEY_CTX *)ctx_00);
LAB_002eecf7:
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  ::cleanup(&date_fmt_reg,(EVP_PKEY_CTX *)ctx_00);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_offset_datetime(location& loc, const context<TC>& ctx)
{
    using char_type = location::char_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    offset_datetime_format_info fmt;

    // ----------------------------------------------------------------------
    // date part

    auto date_fmt_reg = parse_local_date_only(loc, ctx);
    if(date_fmt_reg.is_err())
    {
        return err(date_fmt_reg.unwrap_err());
    }

    // ----------------------------------------------------------------------
    // delimiter

    if(loc.current() == char_type('T'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::upper_T;
    }
    else if(loc.current() == char_type('t'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::lower_t;
    }
    else if(loc.current() == char_type(' '))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::space;
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_offset_datetime: "
            "expect date-time delimiter `T` or ` `(space).", std::move(src), "here"
        ));
    }

    // ----------------------------------------------------------------------
    // time part

    auto time_fmt_reg = parse_local_time_only(loc, ctx);
    if(time_fmt_reg.is_err())
    {
        return err(time_fmt_reg.unwrap_err());
    }

    fmt.has_seconds         = std::get<1>(time_fmt_reg.unwrap()).has_seconds;
    fmt.subsecond_precision = std::get<1>(time_fmt_reg.unwrap()).subsecond_precision;

    // ----------------------------------------------------------------------
    // offset part

    const auto ofs_reg = syntax::time_offset(spec).scan(loc);
    if( ! ofs_reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_offset_datetime: "
            "invalid offset: offset must be like: Z, +01:00, or -10:00.",
            syntax::time_offset(spec), loc));
    }

    const auto ofs_str = ofs_reg.as_string();

    time_offset offset(0, 0);

    assert(ofs_str.size() != 0);

    if(ofs_str.at(0) == char_type('+') || ofs_str.at(0) == char_type('-'))
    {
        const auto hour_r   = from_string<int>(ofs_str.substr(1, 2));
        const auto minute_r = from_string<int>(ofs_str.substr(4, 2));
        if(hour_r.is_err())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_offset_datetime: "
                "Failed to read offset hour part", std::move(src), "here"));
        }
        if(minute_r.is_err())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_offset_datetime: "
                "Failed to read offset minute part", std::move(src), "here"));
        }
        const auto hour   = hour_r.unwrap();
        const auto minute = minute_r.unwrap();

        if(ofs_str.at(0) == '+')
        {
            offset = time_offset(hour, minute);
        }
        else
        {
            offset = time_offset(-hour, -minute);
        }
    }
    else
    {
        assert(ofs_str.at(0) == char_type('Z') || ofs_str.at(0) == char_type('z'));
    }

    if (offset.hour   < -24 || 24 < offset.hour ||
        offset.minute < -60 || 60 < offset.minute)
    {
        return err(make_error_info("toml::parse_offset_datetime: "
            "too large offset: |hour| <= 24, |minute| <= 60",
            source_location(region(first, loc)), "here"));
    }


    // ----------------------------------------------------------------------

    region reg(first, loc);
    offset_datetime val(local_datetime(std::get<0>(date_fmt_reg.unwrap()),
                                       std::get<0>(time_fmt_reg.unwrap())),
                                       offset);

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}